

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O2

void __thiscall QRestReply::~QRestReply(QRestReply *this)

{
  _Optional_payload_base<QStringDecoder> *this_00;
  
  this_00 = (_Optional_payload_base<QStringDecoder> *)this->d;
  if (this_00 != (_Optional_payload_base<QStringDecoder> *)0x0) {
    std::_Optional_payload_base<QStringDecoder>::_M_reset(this_00);
  }
  operator_delete(this_00,0x40);
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)this);
  return;
}

Assistant:

QRestReply::~QRestReply()
{
    delete d;
}